

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O0

void __thiscall despot::POMDPX::InitRewards(POMDPX *this)

{
  double dVar1;
  Parser *this_00;
  value_type pPVar2;
  int iVar3;
  reference pvVar4;
  reference pvVar5;
  undefined4 extraout_var;
  size_type sVar6;
  const_reference pvVar7;
  reference ppPVar8;
  double dVar9;
  State *next;
  int i;
  vector<despot::State,_std::allocator<despot::State>_> *transition;
  int a;
  int s;
  POMDPX *this_local;
  
  if ((this->is_small_ & 1U) != 0) {
    iVar3 = (*(this->super_MDP)._vptr_MDP[2])();
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(&this->rewards_,(long)iVar3);
    transition._4_4_ = 0;
    while( true ) {
      iVar3 = (*(this->super_MDP)._vptr_MDP[2])();
      if (iVar3 <= (int)transition._4_4_) break;
      pvVar4 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->rewards_,(long)(int)transition._4_4_);
      iVar3 = (*(this->super_MDP)._vptr_MDP[3])();
      std::vector<double,_std::allocator<double>_>::resize(pvVar4,(long)iVar3);
      transition._0_4_ = 0;
      while( true ) {
        iVar3 = (*(this->super_MDP)._vptr_MDP[3])();
        if (iVar3 <= (int)(uint)transition) break;
        pvVar4 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&this->rewards_,(long)(int)transition._4_4_);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           (pvVar4,(long)(int)(uint)transition);
        *pvVar5 = 0.0;
        iVar3 = (*(this->super_MDP)._vptr_MDP[4])
                          (this,(ulong)transition._4_4_,(ulong)(uint)transition);
        next._4_4_ = 0;
        while( true ) {
          sVar6 = std::vector<despot::State,_std::allocator<despot::State>_>::size
                            ((vector<despot::State,_std::allocator<despot::State>_> *)
                             CONCAT44(extraout_var,iVar3));
          if (sVar6 <= (ulong)(long)next._4_4_) break;
          pvVar7 = std::vector<despot::State,_std::allocator<despot::State>_>::operator[]
                             ((vector<despot::State,_std::allocator<despot::State>_> *)
                              CONCAT44(extraout_var,iVar3),(long)next._4_4_);
          dVar1 = pvVar7->weight;
          this_00 = this->parser_;
          ppPVar8 = std::vector<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>::
                    operator[](&this->states_,(long)(int)transition._4_4_);
          pPVar2 = *ppPVar8;
          ppPVar8 = std::vector<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>::
                    operator[](&this->states_,(long)pvVar7->state_id);
          dVar9 = Parser::GetReward(this_00,&pPVar2->vec_id,&(*ppPVar8)->vec_id,(uint)transition);
          pvVar4 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&this->rewards_,(long)(int)transition._4_4_);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             (pvVar4,(long)(int)(uint)transition);
          *pvVar5 = dVar1 * dVar9 + *pvVar5;
          next._4_4_ = next._4_4_ + 1;
        }
        transition._0_4_ = (uint)transition + 1;
      }
      transition._4_4_ = transition._4_4_ + 1;
    }
    return;
  }
  __assert_fail("is_small_",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/pomdpx/pomdpx.cpp"
                ,0x163,"void despot::POMDPX::InitRewards()");
}

Assistant:

void POMDPX::InitRewards() {
	assert(is_small_);

	rewards_.resize(NumStates());

	for (int s = 0; s < NumStates(); s++) {
		rewards_[s].resize(NumActions());
		for (int a = 0; a < NumActions(); a++) {
			rewards_[s][a] = 0.0;
			const vector<State>& transition = TransitionProbability(s, a);
			for (int i = 0; i< transition.size(); i++) {
				const State& next = transition[i];
				rewards_[s][a] += next.weight
					* parser_->GetReward(states_[s]->vec_id,
						states_[next.state_id]->vec_id, a);
			}
		}
	}
}